

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

void vector_push_front_empty(vector v)

{
  int iVar1;
  void *__dest;
  vector in_RDI;
  vector in_stack_00000008;
  
  if (in_RDI != (vector)0x0) {
    if ((in_RDI->size == in_RDI->capacity) &&
       (iVar1 = vector_reserve(in_stack_00000008,(size_t)v), iVar1 != 0)) {
      log_write_impl_va("metacall",0x156,"vector_push_front_empty",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
    }
    __dest = vector_data_offset_bytes(in_RDI,in_RDI->type_size);
    memmove(__dest,in_RDI->data,in_RDI->size * in_RDI->type_size);
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void vector_push_front_empty(vector v)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		memmove(vector_data_offset_bytes(v, v->type_size), v->data, v->size * v->type_size);

		++v->size;
	}
}